

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

natwm_error button_handle_focus(natwm_state *state,workspace *workspace,client *client)

{
  natwm_error err;
  client *client_local;
  workspace *workspace_local;
  natwm_state *state_local;
  
  state_local._4_4_ = workspace_focus_client(state,workspace,client);
  if (state_local._4_4_ == NO_ERROR) {
    xcb_allow_events(state->xcb,2,0);
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error button_handle_focus(struct natwm_state *state, struct workspace *workspace,
                                     struct client *client)
{
        enum natwm_error err = workspace_focus_client(state, workspace, client);

        if (err != NO_ERROR) {
                return err;
        }

        // For the focus event we queue the event, and once we have
        // focused both the workspace (if needed) and the client we
        // release the queued event and the client receives the event
        // like normal
        xcb_allow_events(state->xcb, XCB_ALLOW_REPLAY_POINTER, XCB_CURRENT_TIME);

        return NO_ERROR;
}